

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.h
# Opt level: O2

void __thiscall
google::protobuf::json_internal::ParseProto2Descriptor::SetString
          (ParseProto2Descriptor *this,Field f,Msg *msg,string_view x)

{
  Message *message;
  bool bVar1;
  string *this_00;
  Metadata MVar2;
  allocator<char> local_71;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  string local_60;
  string local_40;
  
  local_70._M_str = (char *)x._M_len;
  local_70._M_len = (size_t)msg;
  RecordAsSeen((Field)this,(Msg *)f);
  bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)this);
  MVar2 = Message::GetMetadata(*(Message **)f);
  message = *(Message **)f;
  if (bVar1) {
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_40,&local_70,&local_71);
    Reflection::AddString(MVar2.reflection,message,(FieldDescriptor *)this,&local_40);
    this_00 = &local_40;
  }
  else {
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_60,&local_70,&local_71);
    Reflection::SetString(MVar2.reflection,message,(FieldDescriptor *)this,&local_60);
    this_00 = &local_60;
  }
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

static void SetString(Field f, Msg& msg, absl::string_view x) {
    RecordAsSeen(f, msg);
    if (f->is_repeated()) {
      msg.msg_->GetReflection()->AddString(msg.msg_, f, std::string(x));
    } else {
      msg.msg_->GetReflection()->SetString(msg.msg_, f, std::string(x));
    }
  }